

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O1

void __thiscall QToolBoxPrivate::_q_widgetDestroyed(QToolBoxPrivate *this,QObject *object)

{
  QObject *this_00;
  pointer puVar1;
  Page *pPVar2;
  Page *pPVar3;
  Page *pPVar4;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  pointer puVar5;
  long lVar6;
  Page *pPVar7;
  pointer puVar8;
  iterator __first;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (object != (QObject *)0x0) {
    for (puVar8 = (this->pageList).
                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar8 != (this->pageList).
                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
      pPVar7 = (puVar8->_M_t).
               super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
               ._M_t.
               super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
               .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
      if (pPVar7->widget == (QWidget *)object) goto LAB_004c0acc;
    }
  }
  pPVar7 = (Page *)0x0;
LAB_004c0acc:
  if (pPVar7 != (Page *)0x0) {
    this_00 = *(QObject **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    QLayout::removeWidget((QLayout *)this->layout,(QWidget *)pPVar7->sv);
    QLayout::removeWidget((QLayout *)this->layout,(QWidget *)pPVar7->button);
    QObject::deleteLater();
    if (pPVar7->button != (QToolBoxButton *)0x0) {
      (**(code **)(*(long *)&(pPVar7->button->super_QAbstractButton).super_QWidget + 0x20))();
    }
    puVar8 = (this->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)puVar1 - (long)puVar8 >> 5;
    puVar5 = puVar8;
    if (0 < lVar6) {
      puVar5 = (pointer)((long)&(puVar8->_M_t).
                                super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                                .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl
                        + ((long)puVar1 - (long)puVar8 & 0xffffffffffffffe0U));
      lVar6 = lVar6 + 1;
      __first._M_current = puVar8 + 2;
      do {
        if (__first._M_current[-2]._M_t.
            super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
            ._M_t.
            super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
            .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar7) {
          __first._M_current = __first._M_current + -2;
          goto LAB_004c0bbb;
        }
        if (__first._M_current[-1]._M_t.
            super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
            ._M_t.
            super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
            .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar7) {
          __first._M_current = __first._M_current + -1;
          goto LAB_004c0bbb;
        }
        if (((__first._M_current)->_M_t).
            super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
            ._M_t.
            super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
            .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar7)
        goto LAB_004c0bbb;
        if (__first._M_current[1]._M_t.
            super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
            ._M_t.
            super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
            .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl == pPVar7) {
          __first._M_current = __first._M_current + 1;
          goto LAB_004c0bbb;
        }
        lVar6 = lVar6 + -1;
        __first._M_current = __first._M_current + 4;
      } while (1 < lVar6);
    }
    lVar6 = (long)puVar1 - (long)puVar5 >> 3;
    if (lVar6 == 1) {
LAB_004c0b9f:
      __first._M_current = puVar5;
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar7) {
        __first._M_current = puVar1;
      }
    }
    else if (lVar6 == 2) {
LAB_004c0b96:
      __first._M_current = puVar5;
      if ((puVar5->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar7) {
        puVar5 = puVar5 + 1;
        goto LAB_004c0b9f;
      }
    }
    else {
      __first._M_current = puVar1;
      if ((lVar6 == 3) &&
         (__first._M_current = puVar5,
         (puVar5->_M_t).
         super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
         _M_t.
         super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
         .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl != pPVar7)) {
        puVar5 = puVar5 + 1;
        goto LAB_004c0b96;
      }
    }
LAB_004c0bbb:
    pPVar2 = this->currentPage;
    puVar8 = __first._M_current + 1;
    if (puVar8 != puVar1 && __first._M_current != puVar1) {
      do {
        pPVar3 = (puVar8->_M_t).
                 super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                 .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
        if (pPVar3 != pPVar7) {
          (puVar8->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl = (Page *)0x0;
          pPVar4 = ((__first._M_current)->_M_t).
                   super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                   .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl;
          ((__first._M_current)->_M_t).
          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>.
          _M_t.
          super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
          .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl = pPVar3;
          if (pPVar4 != (Page *)0x0) {
            operator_delete(pPVar4,0x18);
          }
          __first._M_current = __first._M_current + 1;
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar1);
    }
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
    ::_M_erase(&this->pageList,__first,
               (this->pageList).
               super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if ((this->pageList).
        super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->pageList).
        super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this->currentPage = (Page *)0x0;
      puStack_40 = &local_4c;
      local_4c = 0xffffffff;
      local_48 = (void *)0x0;
      QMetaObject::activate(this_00,&QToolBox::staticMetaObject,0,&local_48);
    }
    else if (pPVar7 == pPVar2) {
      this->currentPage = (Page *)0x0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QToolBox::setCurrentIndex((QToolBox *)this_00,0);
        return;
      }
      goto LAB_004c0ccd;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004c0ccd:
  __stack_chk_fail();
}

Assistant:

void QToolBoxPrivate::_q_widgetDestroyed(QObject *object)
{
    Q_Q(QToolBox);

    const QToolBoxPrivate::Page * const c = page(object);
    if (!c)
        return;

    layout->removeWidget(c->sv);
    layout->removeWidget(c->button);
    c->sv->deleteLater(); // page might still be a child of sv
    delete c->button;

    bool removeCurrent = c == currentPage;
    pageList.erase(std::remove_if(pageList.begin(), pageList.end(), pageEquals(c)), pageList.end());

    if (pageList.empty()) {
        currentPage = nullptr;
        emit q->currentChanged(-1);
    } else if (removeCurrent) {
        currentPage = nullptr;
        q->setCurrentIndex(0);
    }
}